

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator==(basic_string_view<char,_std::char_traits<char>_> *l,String *r)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  string_view __y;
  
  __x = *l;
  __y = AsStringView<cm::String>::view(r);
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

static string_view view(string_view const& s) { return s; }